

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::SetIntegrationRule
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,int ord)

{
  int ord_local;
  TPZManVector<int,_3> order;
  
  ord_local = ord;
  TPZManVector<int,_3>::TPZManVector(&order,3,&ord_local);
  TPZIntTetra3D::SetOrder
            (&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).fIntRule,&order.super_TPZVec<int>,0)
  ;
  TPZManVector<int,_3>::~TPZManVector(&order);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetIntegrationRule(int ord) {
	TPZManVector<int,3> order(TSHAPE::Dimension,ord);
	this->fIntRule.SetOrder(order);
}